

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::internal::ParseGoogleTestFlagsOnly(int *argc,char **argv)

{
  int iVar1;
  _Alloc_hider str;
  bool bVar2;
  char **in_RDX;
  char **extraout_RDX;
  string *str_00;
  int iVar3;
  long lVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_70;
  string sStack_50;
  
  bStack_70._M_dataplus._M_p = (pointer)&bStack_70.field_2;
  bStack_70._M_string_length = 0;
  bStack_70.field_2._M_local_buf[0] = '\0';
  iVar3 = 1;
  str_00 = (string *)argc;
  do {
    if (*argc <= iVar3) {
      if (g_help_flag != '\0') {
        PrintColorEncoded((char *)str_00);
      }
      std::__cxx11::string::~string((string *)&bStack_70);
      return;
    }
    lVar4 = (long)iVar3;
    StreamableToString<char*>(&sStack_50,(internal *)(argv + lVar4),in_RDX);
    str._M_p = sStack_50._M_dataplus._M_p;
    bVar2 = ParseGoogleTestFlag(sStack_50._M_dataplus._M_p);
    if (bVar2) {
LAB_00121f93:
      iVar1 = *argc;
      for (; iVar1 != lVar4; lVar4 = lVar4 + 1) {
        argv[lVar4] = argv[lVar4 + 1];
      }
      *argc = iVar1 + -1;
      iVar3 = iVar3 + -1;
    }
    else {
      bVar2 = ParseFlag<std::__cxx11::string>(str._M_p,"flagfile",&bStack_70);
      if (bVar2) {
        std::__cxx11::string::_M_assign((string *)FLAGS_gtest_flagfile_abi_cxx11_);
        LoadFlagsFromFile(&bStack_70);
        goto LAB_00121f93;
      }
      bVar2 = std::operator==(&sStack_50,"--help");
      if (bVar2) {
LAB_00121fe0:
        g_help_flag = '\x01';
      }
      else {
        bVar2 = HasGoogleTestFlagPrefix((char *)0x121fdc);
        if (bVar2) goto LAB_00121fe0;
      }
    }
    str_00 = &sStack_50;
    std::__cxx11::string::~string((string *)&sStack_50);
    iVar3 = iVar3 + 1;
    in_RDX = extraout_RDX;
  } while( true );
}

Assistant:

void ParseGoogleTestFlagsOnly(int* argc, char** argv) {
#ifdef GTEST_HAS_ABSL
  if (*argc > 0) {
    // absl::ParseCommandLine() requires *argc > 0.
    auto positional_args = absl::flags_internal::ParseCommandLineImpl(
        *argc, argv, absl::flags_internal::UsageFlagsAction::kHandleUsage,
        absl::flags_internal::OnUndefinedFlag::kReportUndefined);
    // Any command-line positional arguments not part of any command-line flag
    // (or arguments to a flag) are copied back out to argv, with the program
    // invocation name at position 0, and argc is resized. This includes
    // positional arguments after the flag-terminating delimiter '--'.
    // See https://abseil.io/docs/cpp/guides/flags.
    std::copy(positional_args.begin(), positional_args.end(), argv);
    if (static_cast<int>(positional_args.size()) < *argc) {
      argv[positional_args.size()] = nullptr;
      *argc = static_cast<int>(positional_args.size());
    }
  }
#else
  ParseGoogleTestFlagsOnlyImpl(argc, argv);
#endif

  // Fix the value of *_NSGetArgc() on macOS, but if and only if
  // *_NSGetArgv() == argv
  // Only applicable to char** version of argv
#ifdef GTEST_OS_MAC
#ifndef GTEST_OS_IOS
  if (*_NSGetArgv() == argv) {
    *_NSGetArgc() = *argc;
  }
#endif
#endif
}